

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall LowererMD::Simd128LowerShuffle_4(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  IRType IVar5;
  byte bVar6;
  int32 iVar7;
  SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Opnd *this_01;
  Opnd *pOVar8;
  undefined4 *puVar9;
  IntConstOpnd *pIVar10;
  RegOpnd *pRVar11;
  RegOpnd *dst_00;
  RegOpnd *dstOpnd;
  ThreadContextInfo *this_02;
  intptr_t pMemLoc;
  MemRefOpnd *src1Opnd;
  Instr *pIVar12;
  Opnd *local_110;
  Opnd *local_100;
  MemRefOpnd *laneMask;
  uint8 i_1;
  uint8 maxLaneValue;
  uint8 minorityLane;
  RegOpnd *temp3;
  RegOpnd *temp2;
  RegOpnd *temp1;
  Opnd *minSrc;
  Opnd *majSrc;
  Instr *newInstr;
  RegOpnd *temp;
  byte local_98 [4];
  uint8 local_94;
  uint8 j2;
  uint8 j1;
  uint8 i;
  uint8 reArrLanes [4];
  uint8 ordLanes [4];
  Opnd *srcOpnd;
  Instr *pInstr;
  uint local_78;
  uint fromSrc2;
  uint fromSrc1;
  uint8 lanesSrc [4];
  uint8 lanes [4];
  int j;
  Opnd *srcs [6];
  Opnd *dst;
  SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *args;
  OpCode irOpcode;
  Instr *instr_local;
  LowererMD *this_local;
  
  OVar1 = instr->m_opcode;
  this_00 = Simd128GetExtendedArgs(this,instr);
  this_01 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
  memset(lanes,0,0x30);
  lanesSrc[0] = '\0';
  lanesSrc[1] = '\0';
  lanesSrc[2] = '\0';
  lanesSrc[3] = '\0';
  while (bVar4 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Empty
                           (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>
                           ), !bVar4 && (int)lanesSrc < 6) {
    pOVar8 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
    *(Opnd **)(lanes + (long)(int)lanesSrc * 8) = pOVar8;
    lanesSrc = (uint8  [4])((int)lanesSrc + 1);
  }
  pIVar2 = instr->m_prev;
  bVar4 = IR::Opnd::IsSimd128(this_01);
  if ((((!bVar4) || (_lanes == (Opnd *)0x0)) || (bVar4 = IR::Opnd::IsSimd128(_lanes), !bVar4)) ||
     ((srcs[0] == (Opnd *)0x0 || (bVar4 = IR::Opnd::IsSimd128(srcs[0]), !bVar4)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x61f,
                       "(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128())"
                       ,
                       "dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128()"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (((OVar1 != Simd128_Shuffle_I4) && (OVar1 != Simd128_Shuffle_U4)) &&
     (OVar1 != Simd128_Shuffle_F4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x620,
                       "(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4)"
                       ,
                       "irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (((((srcs[1] == (Opnd *)0x0) || (bVar4 = IR::Opnd::IsIntConstOpnd(srcs[1]), !bVar4)) ||
       (srcs[2] == (Opnd *)0x0)) ||
      ((bVar4 = IR::Opnd::IsIntConstOpnd(srcs[2]), !bVar4 || (srcs[3] == (Opnd *)0x0)))) ||
     ((bVar4 = IR::Opnd::IsIntConstOpnd(srcs[3]), !bVar4 ||
      ((srcs[4] == (Opnd *)0x0 || (bVar4 = IR::Opnd::IsIntConstOpnd(srcs[4]), !bVar4)))))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x626,
                       "(srcs[2] && srcs[2]->IsIntConstOpnd() && srcs[3] && srcs[3]->IsIntConstOpnd() && srcs[4] && srcs[4]->IsIntConstOpnd() && srcs[5] && srcs[5]->IsIntConstOpnd())"
                       ,"Type-specialized shuffle is supported only with constant lane indices");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pIVar10 = IR::Opnd::AsIntConstOpnd(srcs[1]);
  iVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
  fromSrc1._0_1_ = (byte)iVar7;
  pIVar10 = IR::Opnd::AsIntConstOpnd(srcs[2]);
  iVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
  fromSrc1._1_1_ = (byte)iVar7;
  pIVar10 = IR::Opnd::AsIntConstOpnd(srcs[3]);
  iVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
  fromSrc1._2_1_ = (byte)iVar7;
  pIVar10 = IR::Opnd::AsIntConstOpnd(srcs[4]);
  iVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
  fromSrc1._3_1_ = (byte)iVar7;
  if (7 < (byte)fromSrc1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62c,"(lanes[0] >= 0 && lanes[0] < 8)","lanes[0] >= 0 && lanes[0] < 8");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (7 < fromSrc1._1_1_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62d,"(lanes[1] >= 0 && lanes[1] < 8)","lanes[1] >= 0 && lanes[1] < 8");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (7 < fromSrc1._2_1_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62e,"(lanes[2] >= 0 && lanes[2] < 8)","lanes[2] >= 0 && lanes[2] < 8");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (7 < fromSrc1._3_1_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62f,"(lanes[3] >= 0 && lanes[3] < 8)","lanes[3] >= 0 && lanes[3] < 8");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  CheckShuffleLanes_4(this,(uint8 *)&fromSrc1,(uint8 *)&fromSrc2,&local_78,
                      (uint *)((long)&pInstr + 4));
  if (local_78 + pInstr._4_4_ != 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x632,"(fromSrc1 + fromSrc2 == 4)","fromSrc1 + fromSrc2 == 4");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if ((local_78 == 4) || (pInstr._4_4_ == 4)) {
    if (local_78 == 4) {
      local_100 = _lanes;
    }
    else {
      local_100 = srcs[0];
    }
    _reArrLanes = local_100;
    InsertShufps(this,(uint8 *)&fromSrc1,this_01,local_100,local_100,instr);
  }
  else if (local_78 == 2) {
    if (((byte)fromSrc1 < 4) && (fromSrc1._1_1_ < 4)) {
      if ((fromSrc1._2_1_ < 4) || (fromSrc1._3_1_ < 4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x63f,"(lanes[2] >= 4 && lanes[3] >= 4)",
                           "lanes[2] >= 4 && lanes[3] >= 4");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      InsertShufps(this,(uint8 *)&fromSrc1,this_01,_lanes,srcs[0],instr);
    }
    else {
      temp._6_1_ = 0;
      temp._5_1_ = 2;
      for (temp._7_1_ = 0; temp._7_1_ < 4; temp._7_1_ = temp._7_1_ + 1) {
        if ((*(char *)((long)&fromSrc2 + (ulong)temp._7_1_) == '\x01') && (temp._6_1_ < 4)) {
          (&local_94)[temp._6_1_] = lanesSrc[(ulong)temp._7_1_ - 4];
          local_98[temp._7_1_] = temp._6_1_;
          temp._6_1_ = temp._6_1_ + 1;
        }
        else if (temp._5_1_ < 4) {
          if (*(char *)((long)&fromSrc2 + (ulong)temp._7_1_) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                               ,0x653,"(lanesSrc[i] == 2)","lanesSrc[i] == 2");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          (&local_94)[temp._5_1_] = lanesSrc[(ulong)temp._7_1_ - 4];
          local_98[temp._7_1_] = temp._5_1_;
          temp._5_1_ = temp._5_1_ + 1;
        }
      }
      IVar5 = IR::Opnd::GetType(this_01);
      pRVar11 = IR::RegOpnd::New(IVar5,this->m_func);
      InsertShufps(this,&local_94,&pRVar11->super_Opnd,_lanes,srcs[0],instr);
      InsertShufps(this,local_98,this_01,&pRVar11->super_Opnd,&pRVar11->super_Opnd,instr);
    }
  }
  else if ((local_78 == 3) || (pInstr._4_4_ == 3)) {
    IVar5 = IR::Opnd::GetType(this_01);
    pRVar11 = IR::RegOpnd::New(IVar5,this->m_func);
    IVar5 = IR::Opnd::GetType(this_01);
    dst_00 = IR::RegOpnd::New(IVar5,this->m_func);
    IVar5 = IR::Opnd::GetType(this_01);
    dstOpnd = IR::RegOpnd::New(IVar5,this->m_func);
    laneMask._7_1_ = 0;
    if (local_78 == 3) {
      local_110 = srcs[0];
      srcs[0] = _lanes;
    }
    else {
      local_110 = _lanes;
    }
    if (srcs[0] == local_110) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x66a,"(majSrc != minSrc)","majSrc != minSrc");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar6 = 8;
    if (local_110 == _lanes) {
      bVar6 = 4;
    }
    for (laneMask._5_1_ = 0; laneMask._5_1_ < 4; laneMask._5_1_ = laneMask._5_1_ + 1) {
      if (((int)(bVar6 - 4) <= (int)(uint)lanesSrc[(ulong)laneMask._5_1_ - 4]) &&
         (lanesSrc[(ulong)laneMask._5_1_ - 4] < bVar6)) {
        laneMask._7_1_ = laneMask._5_1_;
        break;
      }
    }
    this_02 = Func::GetThreadContextInfo(this->m_func);
    pMemLoc = ThreadContextInfo::GetX86FourLanesMaskAddr(this_02,laneMask._7_1_);
    IVar5 = IR::Opnd::GetType(this_01);
    src1Opnd = IR::MemRefOpnd::New(pMemLoc,IVar5,this->m_func,AddrOpndKindDynamicMisc);
    InsertShufps(this,(uint8 *)&fromSrc1,&pRVar11->super_Opnd,srcs[0],srcs[0],instr);
    InsertShufps(this,(uint8 *)&fromSrc1,&dst_00->super_Opnd,local_110,local_110,instr);
    pIVar12 = IR::Instr::New(MOVUPS,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar12);
    Legalize<false>(pIVar12,false);
    pIVar12 = IR::Instr::New(ANDPS,&dst_00->super_Opnd,&dst_00->super_Opnd,&dstOpnd->super_Opnd,
                             this->m_func);
    IR::Instr::InsertBefore(instr,pIVar12);
    Legalize<false>(pIVar12,false);
    pIVar12 = IR::Instr::New(ANDNPS,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&pRVar11->super_Opnd,
                             this->m_func);
    IR::Instr::InsertBefore(instr,pIVar12);
    Legalize<false>(pIVar12,false);
    pIVar12 = IR::Instr::New(ORPS,this_01,&dst_00->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar12);
    Legalize<false>(pIVar12,false);
  }
  IR::Instr::Remove(instr);
  return pIVar2;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerShuffle_4(IR::Instr* instr)
{
    Js::OpCode irOpcode = instr->m_opcode;
    SList<IR::Opnd*> *args = Simd128GetExtendedArgs(instr);
    IR::Opnd *dst = args->Pop();
    IR::Opnd *srcs[6] = { nullptr, nullptr, nullptr, nullptr, nullptr, nullptr };

    int j = 0;
    while (!args->Empty() && j < 6)
    {
        srcs[j++] = args->Pop();
    }

    uint8 lanes[4], lanesSrc[4];
    uint fromSrc1, fromSrc2;
    IR::Instr *pInstr = instr->m_prev;

    Assert(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128());
    Assert(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4);

    // globOpt will type-spec if all lane indices are constants, and within range constraints to match a single SSE instruction
    AssertMsg(srcs[2] && srcs[2]->IsIntConstOpnd() &&
              srcs[3] && srcs[3]->IsIntConstOpnd() &&
              srcs[4] && srcs[4]->IsIntConstOpnd() &&
              srcs[5] && srcs[5]->IsIntConstOpnd(), "Type-specialized shuffle is supported only with constant lane indices");

    lanes[0] = (uint8) srcs[2]->AsIntConstOpnd()->AsInt32();
    lanes[1] = (uint8) srcs[3]->AsIntConstOpnd()->AsInt32();
    lanes[2] = (uint8) srcs[4]->AsIntConstOpnd()->AsInt32();
    lanes[3] = (uint8) srcs[5]->AsIntConstOpnd()->AsInt32();
    Assert(lanes[0] >= 0 && lanes[0] < 8);
    Assert(lanes[1] >= 0 && lanes[1] < 8);
    Assert(lanes[2] >= 0 && lanes[2] < 8);
    Assert(lanes[3] >= 0 && lanes[3] < 8);

    CheckShuffleLanes_4(lanes, lanesSrc, &fromSrc1, &fromSrc2);
    Assert(fromSrc1 + fromSrc2 == 4);

    if (fromSrc1 == 4 || fromSrc2 == 4)
    {
        // can be done with a swizzle
        IR::Opnd *srcOpnd = fromSrc1 == 4 ? srcs[0] : srcs[1];
        InsertShufps(lanes, dst, srcOpnd, srcOpnd, instr);
    }
    else if (fromSrc1 == 2)
    {
        if (lanes[0] < 4 && lanes[1] < 4)
        {
            // x86 friendly shuffle
            Assert(lanes[2] >= 4 && lanes[3] >= 4);
            InsertShufps(lanes, dst, srcs[0], srcs[1], instr);
        }
        else
        {
            // arbitrary shuffle with 2 lanes from each src
            uint8 ordLanes[4], reArrLanes[4];

            // order lanes based on which src they come from
            // compute re-arrangement mask
            for (uint8 i = 0, j1 = 0, j2 = 2; i < 4; i++)
            {
                if (lanesSrc[i] == 1 && j1 < 4)
                {
                    ordLanes[j1] = lanes[i];
                    reArrLanes[i] = j1;
                    j1++;
                }
                else if(j2 < 4)
                {
                    Assert(lanesSrc[i] == 2);
                    ordLanes[j2] = lanes[i];
                    reArrLanes[i] = j2;
                    j2++;
                }
            }
            IR::RegOpnd *temp = IR::RegOpnd::New(dst->GetType(), m_func);
            InsertShufps(ordLanes, temp, srcs[0], srcs[1], instr);
            InsertShufps(reArrLanes, dst, temp, temp, instr);
        }
    }
    else if (fromSrc1 == 3 || fromSrc2 == 3)
    {
        // shuffle with 3 lanes from one src, one from another

        IR::Instr *newInstr;
        IR::Opnd * majSrc, *minSrc;
        IR::RegOpnd *temp1 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp2 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp3 = IR::RegOpnd::New(dst->GetType(), m_func);
        uint8 minorityLane = 0, maxLaneValue;
        majSrc = fromSrc1 == 3 ? srcs[0] : srcs[1];
        minSrc = fromSrc1 == 3 ? srcs[1] : srcs[0];
        Assert(majSrc != minSrc);

        // Algorithm:
        // SHUFPS temp1, majSrc, lanes
        // SHUFPS temp2, minSrc, lanes
        // MOVUPS temp3, [minorityLane mask]
        // ANDPS  temp2, temp3          // mask all lanes but minorityLane
        // ANDNPS temp3, temp1          // zero minorityLane
        // ORPS   dst, temp2, temp3

        // find minorityLane to mask
        maxLaneValue = minSrc == srcs[0] ? 4 : 8;
        for (uint8 i = 0; i < 4; i++)
        {
            if (lanes[i] >= (maxLaneValue - 4) && lanes[i] < maxLaneValue)
            {
                minorityLane = i;
                break;
            }
        }
        IR::MemRefOpnd * laneMask = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86FourLanesMaskAddr(minorityLane), dst->GetType(), m_func);

        InsertShufps(lanes, temp1, majSrc, majSrc, instr);
        InsertShufps(lanes, temp2, minSrc, minSrc, instr);
        newInstr = IR::Instr::New(Js::OpCode::MOVUPS, temp3, laneMask, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDPS, temp2, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDNPS, temp3, temp3, temp1, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ORPS, dst, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }

    instr->Remove();
    return pInstr;
}